

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void Catch::FatalConditionHandler::handleSignal(int sig)

{
  char *pcVar1;
  allocator local_71;
  string local_70;
  allocator local_39;
  string local_38;
  ulong local_18;
  size_t i;
  int sig_local;
  
  i._4_4_ = sig;
  for (local_18 = 0; local_18 < 6; local_18 = local_18 + 1) {
    if (i._4_4_ == *(int *)(signalDefs + local_18 * 0x10)) {
      pcVar1 = *(char **)(signalDefs + local_18 * 0x10 + 8);
      std::allocator<char>::allocator();
      std::__cxx11::string::string((string *)&local_38,pcVar1,&local_39);
      fatal(&local_38,-i._4_4_);
      std::__cxx11::string::~string((string *)&local_38);
      std::allocator<char>::~allocator((allocator<char> *)&local_39);
    }
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"<unknown signal>",&local_71);
  fatal(&local_70,-i._4_4_);
  std::__cxx11::string::~string((string *)&local_70);
  std::allocator<char>::~allocator((allocator<char> *)&local_71);
  return;
}

Assistant:

static void handleSignal( int sig ) {
            for( std::size_t i = 0; i < sizeof(signalDefs)/sizeof(SignalDefs); ++i )
                if( sig == signalDefs[i].id )
                    fatal( signalDefs[i].name, -sig );
            fatal( "<unknown signal>", -sig );
        }